

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O0

unique_ptr<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>_>
__thiscall
PA4Application::RenderObject::createWavefrontInstance
          (RenderObject *this,shared_ptr<Program> *program,string *objname,mat4 *modelWorld)

{
  RenderObject *this_00;
  pointer this_01;
  mat4 *modelWorld_local;
  string *objname_local;
  shared_ptr<Program> *program_local;
  unique_ptr<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>_>
  *object;
  
  this_00 = (RenderObject *)operator_new(0x70);
  RenderObject(this_00,program,modelWorld);
  std::unique_ptr<PA4Application::RenderObject,std::default_delete<PA4Application::RenderObject>>::
  unique_ptr<std::default_delete<PA4Application::RenderObject>,void>
            ((unique_ptr<PA4Application::RenderObject,std::default_delete<PA4Application::RenderObject>>
              *)this,this_00);
  this_01 = std::
            unique_ptr<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>_>
            ::operator->((unique_ptr<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>_>
                          *)this);
  loadWavefront(this_01,objname);
  return (__uniq_ptr_data<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>,_true,_true>
          )(__uniq_ptr_data<PA4Application::RenderObject,_std::default_delete<PA4Application::RenderObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PA4Application::RenderObject> PA4Application::RenderObject::createWavefrontInstance(const std::shared_ptr<Program> & program, const std::string & objname, const glm::mat4 & modelWorld)
{
  std::unique_ptr<RenderObject> object(new RenderObject(program, modelWorld));
  object->loadWavefront(objname);
  return object;
}